

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O0

void __thiscall xLearn::Solver::StartWork(Solver *this)

{
  ostream *poVar1;
  byte *in_RDI;
  Solver *in_stack_00000148;
  Logger *in_stack_ffffffffffffff20;
  allocator local_b9;
  string local_b8 [39];
  allocator local_91;
  string local_90 [24];
  string *in_stack_ffffffffffffff88;
  Logger local_70;
  int in_stack_ffffffffffffff94;
  string *in_stack_ffffffffffffff98;
  LogSeverity in_stack_ffffffffffffffa4;
  allocator local_31;
  Solver *in_stack_ffffffffffffffd0;
  Logger local_c [3];
  
  if ((*in_RDI & 1) == 0) {
    Logger::Logger(&local_70,INFO);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_90,
               "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/solver/solver.cc"
               ,&local_91);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b8,"StartWork",&local_b9);
    poVar1 = Logger::Start(in_stack_ffffffffffffffa4,in_stack_ffffffffffffff98,
                           in_stack_ffffffffffffff94,in_stack_ffffffffffffff88);
    std::operator<<(poVar1,"Start inference work.");
    std::__cxx11::string::~string(local_b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_b9);
    std::__cxx11::string::~string(local_90);
    std::allocator<char>::~allocator((allocator<char> *)&local_91);
    Logger::~Logger(in_stack_ffffffffffffff20);
    start_prediction_work(in_stack_ffffffffffffffd0);
  }
  else {
    Logger::Logger(local_c,INFO);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&stack0xffffffffffffffd0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/solver/solver.cc"
               ,&local_31);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&stack0xffffffffffffff98,"StartWork",(allocator *)&stack0xffffffffffffff97)
    ;
    poVar1 = Logger::Start(in_stack_ffffffffffffffa4,in_stack_ffffffffffffff98,
                           in_stack_ffffffffffffff94,in_stack_ffffffffffffff88);
    std::operator<<(poVar1,"Start training work.");
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff98);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff97);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
    Logger::~Logger((Logger *)poVar1);
    start_train_work(in_stack_00000148);
  }
  return;
}

Assistant:

void Solver::StartWork() {
  if (hyper_param_.is_train) {
    LOG(INFO) << "Start training work.";
    start_train_work();
  } else {
    LOG(INFO) << "Start inference work.";
    start_prediction_work();
  }
}